

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt_InitFont(stbtt_fontinfo *info,uchar *data,int offset)

{
  long lVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  stbtt__buf fontdict;
  ushort uVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  stbtt_uint32 sVar10;
  stbtt_uint32 sVar11;
  stbtt_uint32 sVar12;
  uint uVar13;
  uchar *puVar14;
  ulong uVar15;
  int iVar16;
  stbtt__buf sVar17;
  stbtt_uint32 fdselectoff;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 cstype;
  stbtt__buf b;
  stbtt_uint32 charstrings;
  stbtt_uint32 local_74;
  uchar *puVar18;
  int iStack_60;
  int iStack_5c;
  
  info->data = data;
  info->fontstart = offset;
  (info->cff).data = (uchar *)0x0;
  (info->cff).cursor = 0;
  (info->cff).size = 0;
  sVar6 = stbtt__find_table(data,offset,"cmap");
  sVar7 = stbtt__find_table(data,offset,"loca");
  info->loca = sVar7;
  sVar8 = stbtt__find_table(data,offset,"head");
  info->head = sVar8;
  sVar9 = stbtt__find_table(data,offset,"glyf");
  info->glyf = sVar9;
  sVar10 = stbtt__find_table(data,offset,"hhea");
  info->hhea = sVar10;
  sVar11 = stbtt__find_table(data,offset,"hmtx");
  info->hmtx = sVar11;
  sVar12 = stbtt__find_table(data,offset,"kern");
  info->kern = sVar12;
  sVar12 = stbtt__find_table(data,offset,"GPOS");
  info->gpos = sVar12;
  iVar16 = 0;
  if ((sVar11 != 0 && sVar10 != 0) && (sVar8 != 0 && sVar6 != 0)) {
    if (sVar9 == 0) {
      sVar10 = 2;
      sVar11 = 0;
      sVar8 = 0;
      local_74 = 0;
      sVar7 = stbtt__find_table(data,offset,"CFF ");
      if (sVar7 == 0) {
        return 0;
      }
      (info->fdselect).data = (uchar *)0x0;
      (info->fdselect).cursor = 0;
      (info->fdselect).size = 0;
      (info->fontdicts).data = (uchar *)0x0;
      (info->fontdicts).cursor = 0;
      (info->fontdicts).size = 0;
      (info->cff).data = data + sVar7;
      (info->cff).cursor = 0;
      (info->cff).size = 0x20000000;
      puVar18 = (info->cff).data;
      uVar3 = (info->cff).cursor;
      uVar4 = (info->cff).size;
      if ((long)(int)uVar3 < -2) {
LAB_00117826:
        __assert_fail("!(o > b->size || o < 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                      ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
      }
      lVar1 = (long)(int)uVar3 + 2;
      iVar16 = (int)lVar1;
      if ((int)uVar4 < iVar16) goto LAB_00117826;
      uVar13 = 0;
      if (iVar16 < (int)uVar4) {
        uVar13 = (uint)puVar18[lVar1];
      }
      if ((int)uVar4 < (int)uVar13) goto LAB_00117826;
      stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff98);
      sVar17 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff98);
      sVar17 = stbtt__cff_index_get(sVar17,0);
      puVar14 = sVar17.data;
      stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff98);
      sVar17 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff98);
      info->gsubrs = sVar17;
      stbtt__dict_get_ints
                ((stbtt__buf *)&stack0xffffffffffffffc0,0x11,1,
                 (stbtt_uint32 *)&stack0xffffffffffffffbc);
      stbtt__dict_get_ints
                ((stbtt__buf *)&stack0xffffffffffffffc0,0x106,1,
                 (stbtt_uint32 *)&stack0xffffffffffffff94);
      stbtt__dict_get_ints
                ((stbtt__buf *)&stack0xffffffffffffffc0,0x124,1,
                 (stbtt_uint32 *)&stack0xffffffffffffff90);
      stbtt__dict_get_ints((stbtt__buf *)&stack0xffffffffffffffc0,0x125,1,&local_74);
      sVar17.data._4_4_ = sVar10;
      sVar17.data._0_4_ = sVar8;
      sVar17._8_8_ = puVar18;
      fontdict.data._4_4_ = sVar11;
      fontdict.data._0_4_ = sVar9;
      fontdict._8_8_ = puVar14;
      sVar17 = stbtt__get_subrs(sVar17,fontdict);
      sVar7 = local_74;
      info->subrs = sVar17;
      if (sVar11 == 0 || sVar10 != 2) {
        return 0;
      }
      if (sVar8 != 0) {
        uVar15 = (ulong)local_74;
        if (uVar15 == 0) {
          return 0;
        }
        if (((int)sVar8 < 0) || ((int)uVar4 < (int)sVar8)) goto LAB_00117826;
        sVar17 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff98);
        info->fontdicts = sVar17;
        puVar14 = (uchar *)((ulong)(uVar4 - sVar7) << 0x20);
        puVar18 = puVar18 + uVar15;
        if ((int)(uVar4 - sVar7 | sVar7) < 0 || (int)uVar4 < (int)sVar7) {
          puVar14 = (uchar *)0x0;
          puVar18 = (uchar *)0x0;
        }
        (info->fdselect).data = puVar18;
        *(uchar **)&(info->fdselect).cursor = puVar14;
      }
      if (((int)sVar11 < 0) || ((int)uVar4 < (int)sVar11)) goto LAB_00117826;
      sVar17 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff98);
      info->charstrings = sVar17;
    }
    else if (sVar7 == 0) {
      return 0;
    }
    sVar7 = stbtt__find_table(data,offset,"maxp");
    if (sVar7 == 0) {
      uVar13 = 0xffff;
    }
    else {
      uVar13 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar7 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar7 + 4) >> 8);
    }
    info->numGlyphs = uVar13;
    uVar5 = *(ushort *)(data + (ulong)sVar6 + 2) << 8 | *(ushort *)(data + (ulong)sVar6 + 2) >> 8;
    info->index_map = 0;
    if (uVar5 != 0) {
      uVar13 = sVar6 + 4;
      uVar15 = (ulong)uVar5;
      do {
        uVar5 = *(ushort *)(data + uVar13) << 8 | *(ushort *)(data + uVar13) >> 8;
        if ((uVar5 == 0) ||
           ((uVar5 == 3 &&
            ((uVar5 = *(ushort *)(data + (ulong)uVar13 + 2) << 8 |
                      *(ushort *)(data + (ulong)uVar13 + 2) >> 8, uVar5 == 10 || (uVar5 == 1)))))) {
          uVar2 = *(uint *)(data + (ulong)uVar13 + 4);
          info->index_map =
               (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) +
               sVar6;
        }
        uVar13 = uVar13 + 8;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    iVar16 = 0;
    if (info->index_map != 0) {
      info->indexToLocFormat =
           (uint)(ushort)(*(ushort *)(data + (long)info->head + 0x32) << 8 |
                         *(ushort *)(data + (long)info->head + 0x32) >> 8);
      iVar16 = 1;
    }
  }
  return iVar16;
}

Assistant:

STBTT_DEF int stbtt_InitFont(stbtt_fontinfo *info, const unsigned char *data, int offset)
{
   return stbtt_InitFont_internal(info, (unsigned char *) data, offset);
}